

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

PLYValue * gvr::anon_unknown_3::createValue(ply_type type,ply_encoding encoding)

{
  char cVar1;
  PLYValue *pPVar2;
  undefined **ppuVar3;
  
  if (encoding != ply_little_endian) {
    if (encoding != ply_big_endian) {
      if (encoding != ply_ascii) {
        return (PLYValue *)0x0;
      }
      if (ply_float64 < type) {
        return (PLYValue *)0x0;
      }
      if ((0x2aU >> (type & 0x1f) & 1) != 0) {
        pPVar2 = (PLYValue *)operator_new(0x10);
        ppuVar3 = &PTR__PLYValue_0012fd30;
        goto LAB_00110b4e;
      }
      if ((0x54U >> (type & 0x1f) & 1) != 0) {
        pPVar2 = (PLYValue *)operator_new(0x10);
        ppuVar3 = &PTR__PLYValue_0012fdc0;
        goto LAB_00110b4e;
      }
      if ((0x180U >> (type & 0x1f) & 1) == 0) {
        return (PLYValue *)0x0;
      }
      pPVar2 = (PLYValue *)operator_new(0x10);
      ppuVar3 = &PTR__PLYValue_0012fe50;
      goto LAB_00110ae1;
    }
    switch(type) {
    case ply_int8:
      goto switchD_00110996_caseD_1;
    case ply_uint8:
      goto switchD_00110996_caseD_2;
    case ply_int16:
      pPVar2 = (PLYValue *)operator_new(0x10);
      ppuVar3 = &PTR__PLYValue_00130000;
      break;
    case ply_uint16:
      pPVar2 = (PLYValue *)operator_new(0x10);
      ppuVar3 = &PTR__PLYValue_00130090;
      break;
    case ply_int32:
      pPVar2 = (PLYValue *)operator_new(0x10);
      ppuVar3 = &PTR__PLYValue_00130120;
      goto LAB_00110b4e;
    case ply_uint32:
      pPVar2 = (PLYValue *)operator_new(0x10);
      ppuVar3 = &PTR__PLYValue_001301b0;
      goto LAB_00110b4e;
    case ply_float32:
      cVar1 = gutil::isMSBFirst();
      pPVar2 = (PLYValue *)operator_new(0x10);
      if (cVar1 != '\0') goto LAB_00110b16;
      goto LAB_00110b47;
    case ply_float64:
      cVar1 = gutil::isMSBFirst();
      pPVar2 = (PLYValue *)operator_new(0x10);
      if (cVar1 != '\0') goto LAB_00110a9d;
      goto LAB_00110ada;
    default:
      goto LAB_00110b58;
    }
    goto LAB_00110ab7;
  }
  switch(type) {
  case ply_int8:
switchD_00110996_caseD_1:
    pPVar2 = (PLYValue *)operator_new(0x10);
    ppuVar3 = &PTR__PLYValue_0012fee0;
LAB_00110a2a:
    pPVar2->_vptr_PLYValue = (_func_int **)ppuVar3;
    *(undefined1 *)&pPVar2[1]._vptr_PLYValue = 0;
    return pPVar2;
  case ply_uint8:
switchD_00110996_caseD_2:
    pPVar2 = (PLYValue *)operator_new(0x10);
    ppuVar3 = &PTR__PLYValue_0012ff70;
    goto LAB_00110a2a;
  case ply_int16:
    pPVar2 = (PLYValue *)operator_new(0x10);
    ppuVar3 = &PTR__PLYValue_00130480;
    goto LAB_00110ab7;
  case ply_uint16:
    pPVar2 = (PLYValue *)operator_new(0x10);
    ppuVar3 = &PTR__PLYValue_00130510;
LAB_00110ab7:
    pPVar2->_vptr_PLYValue = (_func_int **)ppuVar3;
    *(undefined2 *)&pPVar2[1]._vptr_PLYValue = 0;
    return pPVar2;
  case ply_int32:
    pPVar2 = (PLYValue *)operator_new(0x10);
    ppuVar3 = &PTR__PLYValue_001305a0;
    break;
  case ply_uint32:
    pPVar2 = (PLYValue *)operator_new(0x10);
    ppuVar3 = &PTR__PLYValue_00130630;
    break;
  case ply_float32:
    cVar1 = gutil::isMSBFirst();
    pPVar2 = (PLYValue *)operator_new(0x10);
    if (cVar1 == '\0') {
LAB_00110b16:
      ppuVar3 = &PTR__PLYValue_00130240;
      break;
    }
LAB_00110b47:
    ppuVar3 = &PTR__PLYValue_001302d0;
    break;
  case ply_float64:
    cVar1 = gutil::isMSBFirst();
    pPVar2 = (PLYValue *)operator_new(0x10);
    if (cVar1 == '\0') {
LAB_00110a9d:
      ppuVar3 = &PTR__PLYValue_00130360;
      goto LAB_00110ae1;
    }
LAB_00110ada:
    ppuVar3 = &PTR__PLYValue_001303f0;
LAB_00110ae1:
    pPVar2->_vptr_PLYValue = (_func_int **)ppuVar3;
    pPVar2[1]._vptr_PLYValue = (_func_int **)0x0;
    return pPVar2;
  default:
LAB_00110b58:
    return (PLYValue *)0x0;
  }
LAB_00110b4e:
  pPVar2->_vptr_PLYValue = (_func_int **)ppuVar3;
  *(undefined4 *)&pPVar2[1]._vptr_PLYValue = 0;
  return pPVar2;
}

Assistant:

PLYValue *createValue(ply_type type, ply_encoding encoding)
{
  if (encoding == ply_ascii)
  {
    switch (type)
    {
      case ply_int8:
      case ply_int16:
      case ply_int32:
        return new PLYValueASCIIInt();

      case ply_uint8:
      case ply_uint16:
      case ply_uint32:
        return new PLYValueASCIIUInt();

      case ply_float32:
      case ply_float64:
        return new PLYValueASCIIDouble();

      default:
        break;
    }
  }
  else if (encoding == ply_big_endian)
  {
    switch (type)
    {
      case ply_int8:
        return new PLYValueInt8();

      case ply_uint8:
        return new PLYValueUInt8();

      case ply_int16:
        return new PLYValueBigInt16();

      case ply_uint16:
        return new PLYValueBigUInt16();

      case ply_int32:
        return new PLYValueBigInt32();

      case ply_uint32:
        return new PLYValueBigUInt32();

      case ply_float32:
        if (gutil::isMSBFirst())
        {
          return new PLYValueFloat32();
        }
        else
        {
          return new PLYValueSwapFloat32();
        }

      case ply_float64:
        if (gutil::isMSBFirst())
        {
          return new PLYValueFloat64();
        }
        else
        {
          return new PLYValueSwapFloat64();
        }

      default:
        break;
    }
  }
  else if (encoding == ply_little_endian)
  {
    switch (type)
    {
      case ply_int8:
        return new PLYValueInt8();

      case ply_uint8:
        return new PLYValueUInt8();

      case ply_int16:
        return new PLYValueLittleInt16();

      case ply_uint16:
        return new PLYValueLittleUInt16();

      case ply_int32:
        return new PLYValueLittleInt32();

      case ply_uint32:
        return new PLYValueLittleUInt32();

      case ply_float32:
        if (gutil::isMSBFirst())
        {
          return new PLYValueSwapFloat32();
        }
        else
        {
          return new PLYValueFloat32();
        }

      case ply_float64:
        if (gutil::isMSBFirst())
        {
          return new PLYValueSwapFloat64();
        }
        else
        {
          return new PLYValueFloat64();
        }

      default:
        break;
    }
  }

  assert(false);

  return 0;
}